

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicToricLattice.cpp
# Opt level: O0

int __thiscall
RhombicToricLattice::neighbour(RhombicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  bool bVar1;
  int iVar2;
  invalid_argument *piVar3;
  int in_ECX;
  long in_RDI;
  cartesian4 cVar4;
  cartesian4 coordinate;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int iVar5;
  int in_stack_ffffffffffffffbc;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar7;
  undefined4 in_stack_ffffffffffffffc4;
  
  if ((in_ECX != 1) && (in_ECX != -1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Sign must be either 1 or -1.");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((((!bVar1) &&
       (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), !bVar1)) &&
      (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), !bVar1)) &&
     (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), !bVar1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Direction must be one of \'xy\', \'xz\', \'yz\' or \'xyz\'.");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar4 = Lattice::indexToCoordinate
                    ((Lattice *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  iVar5 = cVar4.y;
  iVar6 = cVar4.z;
  iVar7 = cVar4.w;
  iVar2 = cVar4.x;
  if (iVar7 == 1) {
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)(iVar2 + (uint)(0 < in_ECX)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)(iVar2 + (uint)(0 < in_ECX)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)(iVar2 + (uint)(in_ECX < 0)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)(iVar2 + (uint)(0 < in_ECX)) % *(int *)(in_RDI + 8);
    }
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)((iVar2 - (uint)(in_ECX < 0)) + *(int *)(in_RDI + 8)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)((iVar2 - (uint)(in_ECX < 0)) + *(int *)(in_RDI + 8)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)((iVar2 - (uint)(0 < in_ECX)) + *(int *)(in_RDI + 8)) % *(int *)(in_RDI + 8);
    }
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iVar2 = (int)((iVar2 - (uint)(in_ECX < 0)) + *(int *)(in_RDI + 8)) % *(int *)(in_RDI + 8);
    }
  }
  iVar2 = Lattice::coordinateToIndex
                    ((Lattice *)CONCAT44(iVar2,iVar7),(cartesian4 *)CONCAT44(iVar6,iVar5));
  return iVar2;
}

Assistant:

int RhombicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "xy" || direction == "xz" || direction == "yz" ||
          direction == "xyz"))
    {
        throw std::invalid_argument("Direction must be one of 'xy', 'xz', 'yz' or 'xyz'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    // if (direction == "x")
    //     coordinate.x = (coordinate.x + sign + l) % l;
    // if (direction == "y")
    //     coordinate.y = (coordinate.y + sign + l) % l;
    // if (direction == "z")
    //     coordinate.z = (coordinate.z + sign + l) % l;
    if (coordinate.w == 1)
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.x = (coordinate.x + (sign < 0)) % l;
            coordinate.w = 0;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x + (sign > 0)) % l;
            coordinate.y = (coordinate.y + (sign > 0)) % l;
            coordinate.z = (coordinate.z + (sign > 0)) % l;
            coordinate.w = 0;
        }
    }
    else
    {
        if (direction == "xy")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "yz")
        {
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.x = (coordinate.x - (sign > 0) + l) % l;
            coordinate.w = 1;
        }
        if (direction == "xyz")
        {
            coordinate.x = (coordinate.x - (sign < 0) + l) % l;
            coordinate.y = (coordinate.y - (sign < 0) + l) % l;
            coordinate.z = (coordinate.z - (sign < 0) + l) % l;
            coordinate.w = 1;
        }
    }
    return coordinateToIndex(coordinate);
}